

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O3

Vec_Wec_t * Gia_ManCreateSupps(Gia_Man_t *p,int fVerbose)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Vec_Wec_t *pVVar9;
  Vec_Int_t *pVVar10;
  Vec_Int_t *pVVar11;
  int *__ptr;
  int *piVar12;
  long lVar13;
  int *piVar14;
  uint uVar15;
  int *piVar16;
  ulong uVar17;
  timespec ts;
  long local_58;
  timespec local_48;
  Vec_Wec_t *local_38;
  
  iVar5 = clock_gettime(3,&local_48);
  if (iVar5 < 0) {
    local_58 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    local_58 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  iVar5 = p->nObjs;
  pVVar9 = (Vec_Wec_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < iVar5 - 1U) {
    iVar6 = iVar5;
  }
  pVVar9->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar10 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar10 = (Vec_Int_t *)calloc((long)iVar6,0x10);
  }
  pVVar9->pArray = pVVar10;
  pVVar9->nSize = iVar5;
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar13 = 0;
    do {
      iVar6 = pVVar11->pArray[lVar13];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      iVar7 = p->nObjs;
      if (iVar6 == 0) goto LAB_0059eac8;
      if (iVar5 <= iVar6) goto LAB_0059ed11;
      Vec_IntPush(pVVar10 + iVar6,(int)lVar13);
      lVar13 = lVar13 + 1;
      pVVar11 = p->vCis;
    } while (lVar13 < pVVar11->nSize);
    iVar5 = p->nObjs;
  }
  iVar7 = iVar5;
  if (0 < iVar5) {
LAB_0059eac8:
    uVar17 = 0;
    local_38 = pVVar9;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar4 = *(undefined8 *)(p->pObjs + uVar17);
      uVar8 = (uint)uVar4;
      if ((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) {
        uVar8 = (int)uVar17 - (uVar8 & 0x1fffffff);
        if ((int)uVar8 < 0) {
LAB_0059ed11:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                        ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        uVar3 = pVVar9->nSize;
        if (((((int)uVar3 <= (int)uVar8) ||
             (uVar15 = (int)uVar17 - ((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff), (int)uVar15 < 0))
            || (uVar3 <= uVar15)) || (uVar3 <= uVar17)) goto LAB_0059ed11;
        pVVar11 = pVVar9->pArray;
        pVVar10 = pVVar11 + uVar17;
        iVar6 = pVVar11[uVar8].nSize;
        iVar7 = pVVar11[uVar15].nSize;
        iVar5 = iVar7 + iVar6;
        __ptr = pVVar11[uVar17].pArray;
        if (pVVar11[uVar17].nCap < iVar5) {
          if (__ptr == (int *)0x0) {
            __ptr = (int *)malloc((long)iVar5 << 2);
          }
          else {
            __ptr = (int *)realloc(__ptr,(long)iVar5 << 2);
          }
          pVVar10->pArray = __ptr;
          if (__ptr == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar10->nCap = iVar5;
          iVar6 = pVVar11[uVar8].nSize;
          iVar7 = pVVar11[uVar15].nSize;
        }
        piVar16 = pVVar11[uVar8].pArray;
        piVar14 = pVVar11[uVar15].pArray;
        piVar1 = piVar16 + iVar6;
        piVar2 = piVar14 + iVar7;
        piVar12 = __ptr;
        if ((0 < iVar6) && (0 < iVar7)) {
          do {
            iVar5 = *piVar16;
            iVar6 = *piVar14;
            if (iVar5 == iVar6) {
              piVar16 = piVar16 + 1;
              *piVar12 = iVar5;
              piVar14 = piVar14 + 1;
            }
            else if (iVar5 < iVar6) {
              piVar16 = piVar16 + 1;
              *piVar12 = iVar5;
            }
            else {
              piVar14 = piVar14 + 1;
              *piVar12 = iVar6;
            }
            piVar12 = piVar12 + 1;
          } while ((piVar16 < piVar1) && (piVar14 < piVar2));
        }
        for (; piVar16 < piVar1; piVar16 = piVar16 + 1) {
          *piVar12 = *piVar16;
          piVar12 = piVar12 + 1;
        }
        for (; piVar14 < piVar2; piVar14 = piVar14 + 1) {
          *piVar12 = *piVar14;
          piVar12 = piVar12 + 1;
        }
        iVar5 = (int)((ulong)((long)piVar12 - (long)__ptr) >> 2);
        pVVar10->nSize = iVar5;
        if (pVVar10->nCap < iVar5) {
          __assert_fail("vArr->nSize <= vArr->nCap",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x707,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        if (iVar5 < pVVar11[uVar8].nSize) {
          __assert_fail("vArr->nSize >= vArr1->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x708,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        if (iVar5 < pVVar11[uVar15].nSize) {
          __assert_fail("vArr->nSize >= vArr2->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x709,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        iVar7 = p->nObjs;
        pVVar9 = local_38;
      }
      uVar17 = uVar17 + 1;
    } while ((long)uVar17 < (long)iVar7);
  }
  if (fVerbose != 0) {
    iVar6 = 3;
    iVar5 = clock_gettime(3,&local_48);
    if (iVar5 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    Abc_Print(iVar6,"%s =","Support computation");
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar13 + local_58) / 1000000.0);
  }
  return pVVar9;
}

Assistant:

Vec_Wec_t * Gia_ManCreateSupps( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; int i, Id;
    Vec_Wec_t * vSupps = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_ManForEachCiId( p, Id, i )
        Vec_IntPush( Vec_WecEntry(vSupps, Id), i );
    Gia_ManForEachAnd( p, pObj, Id )
        Vec_IntTwoMerge2( Vec_WecEntry(vSupps, Gia_ObjFaninId0(pObj, Id)), 
                          Vec_WecEntry(vSupps, Gia_ObjFaninId1(pObj, Id)), 
                          Vec_WecEntry(vSupps, Id) ); 
//    Gia_ManForEachCo( p, pObj, i )
//        Vec_IntAppend( Vec_WecEntry(vSupps, Gia_ObjId(p, pObj)), Vec_WecEntry(vSupps, Gia_ObjFaninId0p(p, pObj)) );
    if ( fVerbose )
        Abc_PrintTime( 1, "Support computation", Abc_Clock() - clk );
    return vSupps;
}